

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto.cpp
# Opt level: O2

void __thiscall gfield::reduce<26>(gfield *this,bigint<26> *result)

{
  digit *__dest;
  uint uVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  gfield s;
  
  iVar3 = 0xc;
  if (result->len < 0xc) {
    iVar3 = result->len;
  }
  (this->super_gfint).len = iVar3;
  memcpy((this->super_gfint).digits,result->digits,(long)iVar3 * 2);
  bigint<13>::shrink(&this->super_gfint);
  uVar1 = result->len;
  if ((int)uVar1 < 0xd) {
    bVar2 = bigint<13>::operator>=(&this->super_gfint,&P.super_gfint);
    if (bVar2) {
      bigint<13>::sub<13,13>(&this->super_gfint,&this->super_gfint,&P.super_gfint);
      return;
    }
  }
  else {
    __dest = s.super_gfint.digits;
    uVar5 = uVar1 - 0xc;
    uVar4 = 4;
    if (uVar5 < 4) {
      uVar4 = uVar5;
    }
    memcpy(__dest,result->digits + 0xc,(ulong)(uVar4 * 2));
    if (uVar1 < 0x10) {
      memset(__dest + uVar5,0,(ulong)uVar1 * -2 + 0x20);
    }
    s.super_gfint.digits[4] = s.super_gfint.digits[0];
    s.super_gfint.digits[5] = s.super_gfint.digits[1];
    s.super_gfint.digits[6] = s.super_gfint.digits[2];
    s.super_gfint.digits[7] = s.super_gfint.digits[3];
    s.super_gfint.len = 8;
    bigint<13>::shrink(&s.super_gfint);
    add<13>(this,&s.super_gfint);
    uVar1 = result->len;
    if (0x10 < (int)uVar1) {
      s.super_gfint.digits[0] = 0;
      s.super_gfint.digits[1] = 0;
      s.super_gfint.digits[2] = 0;
      s.super_gfint.digits[3] = 0;
      uVar4 = uVar1 - 0x10;
      if (3 < uVar1 - 0x10) {
        uVar4 = 4;
      }
      memcpy(s.super_gfint.digits + 4,result->digits + 0x10,(ulong)(uVar4 * 2));
      if (uVar1 < 0x14) {
        memset(__dest + (uVar1 - 0xc),0,(ulong)uVar1 * -2 + 0x28);
      }
      s.super_gfint.digits[8] = s.super_gfint.digits[4];
      s.super_gfint.digits[9] = s.super_gfint.digits[5];
      s.super_gfint.digits[10] = s.super_gfint.digits[6];
      s.super_gfint.digits[0xb] = s.super_gfint.digits[7];
      s.super_gfint.len = 0xc;
      bigint<13>::shrink(&s.super_gfint);
      add<13>(this,&s.super_gfint);
      uVar1 = result->len;
      if (0x14 < (int)uVar1) {
        uVar5 = uVar1 - 0x14;
        uVar4 = 4;
        if (uVar5 < 4) {
          uVar4 = uVar5;
        }
        memcpy(__dest,result->digits + 0x14,(ulong)(uVar4 * 2));
        if (uVar1 < 0x18) {
          memset(__dest + uVar5,0,(ulong)uVar1 * -2 + 0x30);
        }
        s.super_gfint.digits[4] = s.super_gfint.digits[0];
        s.super_gfint.digits[5] = s.super_gfint.digits[1];
        s.super_gfint.digits[6] = s.super_gfint.digits[2];
        s.super_gfint.digits[7] = s.super_gfint.digits[3];
        s.super_gfint.digits[8] = s.super_gfint.digits[0];
        s.super_gfint.digits[9] = s.super_gfint.digits[1];
        s.super_gfint.digits[10] = s.super_gfint.digits[2];
        s.super_gfint.digits[0xb] = s.super_gfint.digits[3];
        s.super_gfint.len = 0xc;
        bigint<13>::shrink(&s.super_gfint);
        add<13>(this,&s.super_gfint);
      }
    }
  }
  return;
}

Assistant:

void reduce(const bigint<RESULT_DIGITS> &result)
    {
#if GF_BITS==192
        len = min(result.len, GF_DIGITS);
        memcpy(digits, result.digits, len*sizeof(digit));
        shrink();

        if(result.len > 192/BI_DIGIT_BITS)
        {
            gfield s;
            memcpy(s.digits, &result.digits[192/BI_DIGIT_BITS], min(result.len-192/BI_DIGIT_BITS, 64/BI_DIGIT_BITS)*sizeof(digit));
            if(result.len < 256/BI_DIGIT_BITS) memset(&s.digits[result.len-192/BI_DIGIT_BITS], 0, (256/BI_DIGIT_BITS-result.len)*sizeof(digit));
            memcpy(&s.digits[64/BI_DIGIT_BITS], s.digits, 64/BI_DIGIT_BITS*sizeof(digit));
            s.len = 128/BI_DIGIT_BITS;
            s.shrink();
            add(s);

            if(result.len > 256/BI_DIGIT_BITS)
            {
                memset(s.digits, 0, 64/BI_DIGIT_BITS*sizeof(digit));
                memcpy(&s.digits[64/BI_DIGIT_BITS], &result.digits[256/BI_DIGIT_BITS], min(result.len-256/BI_DIGIT_BITS, 64/BI_DIGIT_BITS)*sizeof(digit));
                if(result.len < 320/BI_DIGIT_BITS) memset(&s.digits[result.len+(64-256)/BI_DIGIT_BITS], 0, (320/BI_DIGIT_BITS-result.len)*sizeof(digit));
                memcpy(&s.digits[128/BI_DIGIT_BITS], &s.digits[64/BI_DIGIT_BITS], 64/BI_DIGIT_BITS*sizeof(digit));
                s.len = GF_DIGITS;
                s.shrink();
                add(s);

                if(result.len > 320/BI_DIGIT_BITS)
                {
                    memcpy(s.digits, &result.digits[320/BI_DIGIT_BITS], min(result.len-320/BI_DIGIT_BITS, 64/BI_DIGIT_BITS)*sizeof(digit));
                    if(result.len < 384/BI_DIGIT_BITS) memset(&s.digits[result.len-320/BI_DIGIT_BITS], 0, (384/BI_DIGIT_BITS-result.len)*sizeof(digit));
                    memcpy(&s.digits[64/BI_DIGIT_BITS], s.digits, 64/BI_DIGIT_BITS*sizeof(digit));
                    memcpy(&s.digits[128/BI_DIGIT_BITS], s.digits, 64/BI_DIGIT_BITS*sizeof(digit));
                    s.len = GF_DIGITS;
                    s.shrink();
                    add(s);
                }
            }
        }
        else if(*this >= P) gfint::sub(*this, P);
#else
#error Unsupported GF
#endif
    }